

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O3

void lws_mqtt_str_init(lws_mqtt_str_t *s,uint8_t *buf,uint16_t lim,char nf)

{
  s->len = 0;
  s->pos = 0;
  s->buf = buf;
  s->limit = lim;
  s->len_valid = '\0';
  s->needs_freeing = nf;
  return;
}

Assistant:

void
lws_mqtt_str_init(lws_mqtt_str_t *s, uint8_t *buf, uint16_t lim, char nf)
{
	s->len = 0;	/* at COMPLETED, consumed count is s->len + 2 */
	s->pos = 0;
	s->buf = buf;
	s->limit = lim;
	s->len_valid = 0;
	s->needs_freeing = nf;
}